

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

string * CLI::detail::trim_copy(string *__return_storage_ptr__,string *str)

{
  string *psVar1;
  string s;
  string local_30;
  
  ::std::__cxx11::string::string((string *)&local_30,(string *)str);
  psVar1 = trim(&local_30);
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  ::std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

inline std::string trim_copy(const std::string &str) {
    std::string s = str;
    return trim(s);
}